

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::~IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pLVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  (this->super_IfcStyleModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x827698;
  *(undefined8 *)&(this->super_IfcStyleModel).field_0xa0 = 0x8276c0;
  pLVar2 = (this->super_IfcStyleModel).super_IfcRepresentation.Items.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2,(long)*(pointer *)
                                  ((long)&(this->super_IfcStyleModel).super_IfcRepresentation.Items.
                                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                          .
                                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pLVar2);
  }
  pcVar3 = (this->super_IfcStyleModel).super_IfcRepresentation.RepresentationType.ptr._M_dataplus.
           _M_p;
  paVar1 = &(this->super_IfcStyleModel).super_IfcRepresentation.RepresentationType.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcStyleModel).super_IfcRepresentation.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x18;
  puVar5 = &(this->super_IfcStyleModel).super_IfcRepresentation.field_0x28;
  if (puVar4 != puVar5) {
    operator_delete(puVar4,*(long *)puVar5 + 1);
    return;
  }
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}